

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O3

void initSearchTree(int *array,int length,Tree<int> *tree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  int *piVar5;
  long *plVar6;
  bool bVar7;
  ulong uVar8;
  long *plVar9;
  
  if (length == 0) {
    (*tree->_vptr_Tree[9])(tree,0);
    return;
  }
  puVar4 = (undefined8 *)operator_new(0x30);
  *puVar4 = &PTR_getLeftPoint_00106d58;
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  puVar4[3] = array;
  *(undefined4 *)(puVar4 + 4) = 0;
  puVar4[5] = 0;
  (*tree->_vptr_Tree[9])(tree,puVar4);
  if (1 < length) {
    bVar7 = true;
    uVar8 = 1;
    plVar9 = (long *)0x0;
    do {
      iVar3 = (*tree->_vptr_Tree[8])();
      plVar6 = (long *)CONCAT44(extraout_var,iVar3);
LAB_00102439:
      if (plVar6 != (long *)0x0) {
        iVar1 = array[uVar8];
        piVar5 = (int *)(**(code **)(*plVar6 + 0x20))(plVar6);
        iVar3 = *piVar5;
        plVar9 = plVar6;
        if (iVar3 < iVar1) goto LAB_0010245b;
        puVar4 = (undefined8 *)*plVar6;
        goto LAB_0010247a;
      }
      puVar4 = (undefined8 *)operator_new(0x30);
      *puVar4 = &PTR_getLeftPoint_00106d58;
      puVar4[1] = 0;
      *(undefined4 *)(puVar4 + 2) = 0;
      puVar4[3] = array + uVar8;
      *(undefined4 *)(puVar4 + 4) = 0;
      puVar4[5] = 0;
      (**(code **)(*plVar9 + 8 + (ulong)(((byte)~bVar7 & 1) << 6)))(plVar9,puVar4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)length);
  }
  return;
LAB_0010245b:
  iVar2 = array[uVar8];
  piVar5 = (int *)(**(code **)(*plVar6 + 0x20))(plVar6);
  if (*piVar5 < iVar2) {
    puVar4 = (undefined8 *)(*plVar6 + 0x40);
LAB_0010247a:
    plVar6 = (long *)(*(code *)*puVar4)(plVar6);
    bVar7 = iVar1 <= iVar3;
  }
  goto LAB_00102439;
}

Assistant:

void initSearchTree(int* array, int length, Tree<int>& tree){
    if (length == 0){
        tree.setRoot(nullptr);
        return;
    }
    Node<int>* node = new Node<int>(array[0]);
    Node<int>* parent = nullptr;
    bool isLeft = true;
    tree.setRoot(node);
    for (int i = 1; i < length; ++i) {
        node = tree.getRoot();
        while (node){
            parent = node;
            if (array[i] <= node->getDataNode()){
                node = node->getLeftPoint();
                isLeft = true;
            } else if (array[i] > node->getDataNode()){
                    node = node->getRightPoint();
                    isLeft = false;
            }
        }
        node = new Node<int>(array[i]);
        if (isLeft){
            parent->setLeftPoint(node);
        } else {
            parent->setRightPoint(node);
        }
    }
}